

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

void __thiscall CRegexParser::add_range_char(CRegexParser *this,wchar_t ch1,wchar_t ch2)

{
  size_t sVar1;
  
  if (ch1 == L'\0') {
    add_range_class(this,RE_NULLCHAR);
    if (ch2 == L'\0') {
      return;
    }
    ch1 = L'\x01';
  }
  ensure_range_buf_space(this);
  sVar1 = this->range_buf_cnt_;
  this->range_buf_cnt_ = sVar1 + 1;
  this->range_buf_[sVar1] = ch1;
  sVar1 = this->range_buf_cnt_;
  this->range_buf_cnt_ = sVar1 + 1;
  this->range_buf_[sVar1] = ch2;
  return;
}

Assistant:

void CRegexParser::add_range_char(wchar_t ch1, wchar_t ch2)
{
    /* 
     *   if the first character in the range is null, it requires special
     *   representation 
     */
    if (ch1 == 0)
    {
        /* 
         *   A null character must be represented using the character class
         *   notation for RE_NULLCHAR, because a null lead character in a
         *   pair has the special meaning of introducing a class specifier
         *   in the second character of the pair.  So, first add the null
         *   character as a class character.
         */
        add_range_class(RE_NULLCHAR);

        /* 
         *   if the second character of the range is null, we're done, since
         *   all we needed was the null itself 
         */
        if (ch2 == 0)
            return;

        /* 
         *   we've added the null character, so simply add the rest of the
         *   range starting at character code 1 
         */
        ch1 = 1;
    }

    /* make sure we have space in the range buffer for the added entry */
    ensure_range_buf_space();

    /* add the new entry */
    range_buf_[range_buf_cnt_++] = ch1;
    range_buf_[range_buf_cnt_++] = ch2;
}